

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

Maybe<kj::Array<char>_> *
kj::parse::Many_<const_kj::parse::Any__&,_false>::
Impl<kj::parse::IteratorInput<char,_const_char_*>,_char>::apply
          (Maybe<kj::Array<char>_> *__return_storage_ptr__,Any_ *subParser,
          IteratorInput<char,_const_char_*> *input)

{
  bool bVar1;
  NullableValue<char> *other;
  char *pcVar2;
  Array<char> local_90;
  int local_74;
  Maybe<char> local_70;
  NullableValue<char> local_6e [4];
  NullableValue<char> subResult;
  undefined1 local_60 [8];
  IteratorInput<char,_const_char_*> subInput;
  Results results;
  IteratorInput<char,_const_char_*> *input_local;
  Any_ *subParser_local;
  
  Vector<char>::Vector((Vector<char> *)&subInput.best);
  do {
    bVar1 = IteratorInput<char,_const_char_*>::atEnd(input);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    IteratorInput<char,_const_char_*>::IteratorInput
              ((IteratorInput<char,_const_char_*> *)local_60,input);
    Any_::operator()((Any_ *)&local_70,(IteratorInput<char,_const_char_*> *)subParser);
    other = kj::_::readMaybe<char>(&local_70);
    kj::_::NullableValue<char>::NullableValue(local_6e,other);
    Maybe<char>::~Maybe(&local_70);
    pcVar2 = kj::_::NullableValue::operator_cast_to_char_((NullableValue *)local_6e);
    if (pcVar2 == (char *)0x0) {
      local_74 = 3;
    }
    else {
      IteratorInput<char,_const_char_*>::advanceParent
                ((IteratorInput<char,_const_char_*> *)local_60);
      pcVar2 = kj::_::NullableValue<char>::operator*(local_6e);
      pcVar2 = mv<char>(pcVar2);
      Vector<char>::add<char>((Vector<char> *)&subInput.best,pcVar2);
      local_74 = 0;
    }
    kj::_::NullableValue<char>::~NullableValue(local_6e);
    if (local_74 == 0) {
      local_74 = 0;
    }
    IteratorInput<char,_const_char_*>::~IteratorInput((IteratorInput<char,_const_char_*> *)local_60)
    ;
  } while (local_74 == 0);
  Vector<char>::releaseAsArray(&local_90,(Vector<char> *)&subInput.best);
  Maybe<kj::Array<char>_>::Maybe(__return_storage_ptr__,&local_90);
  Array<char>::~Array(&local_90);
  local_74 = 1;
  Vector<char>::~Vector((Vector<char> *)&subInput.best);
  return __return_storage_ptr__;
}

Assistant:

static Maybe<Array<Output>> apply(const SubParser& subParser, Input& input) {
    typedef Vector<OutputType<SubParser, Input>> Results;
    Results results;

    while (!input.atEnd()) {
      Input subInput(input);

      KJ_IF_MAYBE(subResult, subParser(subInput)) {
        subInput.advanceParent();
        results.add(kj::mv(*subResult));
      } else {
        break;
      }
    }